

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96PubkeyCalc(octet *pubkey,bign_params *params,octet *privkey)

{
  size_t n_00;
  bool_t bVar1;
  int iVar2;
  long *plVar3;
  word *a;
  bign_params *in_RDX;
  long *in_RSI;
  bign96_deep_i in_RDI;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffffa8;
  u64 *src;
  u64 *dest;
  err_t local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    eVar4 = 0x6d;
  }
  else if (*in_RSI == 0x60) {
    bign96Start_keep(in_RDI);
    plVar3 = (long *)blobCreate(in_stack_ffffffffffffffa8);
    if (plVar3 == (long *)0x0) {
      eVar4 = 0x6e;
    }
    else {
      eVar4 = bign96Start(in_RSI,in_RDX);
      if (eVar4 == 0) {
        n_00 = *(size_t *)(plVar3[3] + 0x30);
        bVar1 = memIsValid(in_RDX,0x18);
        if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,0x30), bVar1 != 0)) {
          a = (word *)((long)plVar3 + *plVar3);
          dest = a + n_00;
          src = dest + n_00 * 2;
          u64From(dest,src,0x16585a);
          bVar1 = wwIsZero(a,n_00);
          if ((bVar1 == 0) && (iVar2 = wwCmp(a,(word *)plVar3[7],n_00), iVar2 < 0)) {
            bVar1 = ecMulA((word *)ec,d,(ec_o *)Q,(word *)stack,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
            if (bVar1 == 0) {
              local_24 = 0x1f6;
            }
            else {
              (**(code **)(plVar3[3] + 0x48))(in_RDI,dest,plVar3[3],src);
              (**(code **)(plVar3[3] + 0x48))(in_RDI + 0x18,dest + n_00,plVar3[3],src);
              local_24 = 0;
            }
            blobClose((blob_t)0x16593d);
            return local_24;
          }
          blobClose((blob_t)0x165895);
          return 0x1f8;
        }
        blobClose((blob_t)0x1657f9);
        eVar4 = 0x6d;
      }
      else {
        blobClose((blob_t)0x16579e);
      }
    }
  }
  else {
    eVar4 = 0x1f6;
  }
  return eVar4;
}

Assistant:

err_t bign96PubkeyCalc(octet pubkey[48], const bign_params* params,
	const octet privkey[24])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96PubkeyCalc_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить открытый ключ
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + 24, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}